

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.hpp
# Opt level: O3

void __thiscall
Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>::Video
          (Video<(Sinclair::ZXSpectrum::Video::Timing)2> *this)

{
  CRT *this_00;
  Rect visible_area;
  
  this->time_into_frame_ = 0;
  this_00 = &this->crt_;
  Outputs::CRT::CRT::CRT(this_00,0x1c6,2,PAL50,Red2Green2Blue2);
  this->memory_ = (uint8_t *)0x0;
  this->border_colour_ = '\0';
  this->border_byte_ = '\0';
  this->flash_counter_ = 0;
  this->is_alternate_line_ = false;
  this->pixel_target_ = (uint8_t *)0x0;
  this->attribute_address_ = 0;
  this->pixel_address_ = 0;
  this->flash_mask_ = '\0';
  this->last_fetches_[0] = 0xff;
  this->last_fetches_[1] = 0xff;
  this->last_fetches_[2] = 0xff;
  this->last_fetches_[3] = 0xff;
  this->last_contended_access_ = 0xff;
  Outputs::CRT::CRT::set_display_type(this_00,RGB);
  visible_area.size.width = 0.8;
  visible_area.size.height = 0.8;
  visible_area.origin.x = 0.1;
  visible_area.origin.y = 0.1;
  Outputs::CRT::CRT::set_visible_area(this_00,visible_area);
  Outputs::CRT::CRT::output_blank(this_00,0x703e);
  return;
}

Assistant:

Video() :
			crt_(half_cycles_per_line(), 2, Outputs::Display::Type::PAL50, Outputs::Display::InputDataType::Red2Green2Blue2)
		{
			// Show only the centre 80% of the TV frame.
			crt_.set_display_type(Outputs::Display::DisplayType::RGB);
			crt_.set_visible_area(Outputs::Display::Rect(0.1f, 0.1f, 0.8f, 0.8f));

			// Get the CRT roughly into phase.
			//
			// TODO: this is coupled to an assumption about the initial CRT. Fix.
			const auto timings = get_timings();
			crt_.output_blank(timings.lines_per_frame*timings.half_cycles_per_line - timings.interrupt_time);
		}